

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

optional<BCLog::Level> GetLogLevel(string_view level_str)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  ulong uStack_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0x100000000;
  __y._M_str = "trace";
  __y._M_len = 5;
  bVar2 = std::operator==(level_str,__y);
  if (bVar2) {
    uStack_30 = 0;
  }
  else {
    __y_00._M_str = "debug";
    __y_00._M_len = 5;
    bVar2 = std::operator==(level_str,__y_00);
    if (bVar2) {
      uStack_30 = 1;
    }
    else {
      uStack_30 = 4;
      __y_01._M_str = "info";
      __y_01._M_len = 4;
      bVar2 = std::operator==(level_str,__y_01);
      if (bVar2) {
        uStack_30 = 2;
      }
      else {
        __y_02._M_str = "warning";
        __y_02._M_len = 7;
        bVar2 = std::operator==(level_str,__y_02);
        if (bVar2) {
          uStack_30 = 3;
        }
        else {
          __y_03._M_str = "error";
          __y_03._M_len = 5;
          bVar2 = std::operator==(level_str,__y_03);
          if (!bVar2) {
            uVar3 = 0;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (_Optional_base<BCLog::Level,_true,_true>)
         (_Optional_base<BCLog::Level,_true,_true>)(uVar3 | uStack_30);
}

Assistant:

static std::optional<BCLog::Level> GetLogLevel(std::string_view level_str)
{
    if (level_str == "trace") {
        return BCLog::Level::Trace;
    } else if (level_str == "debug") {
        return BCLog::Level::Debug;
    } else if (level_str == "info") {
        return BCLog::Level::Info;
    } else if (level_str == "warning") {
        return BCLog::Level::Warning;
    } else if (level_str == "error") {
        return BCLog::Level::Error;
    } else {
        return std::nullopt;
    }
}